

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O3

void __thiscall glauber::Collider::Collider(Collider *this,VarMap *var_map)

{
  int iVar1;
  _Head_base<0UL,_glauber::Nucleus_*,_false> _Var2;
  Nucleus *pNVar3;
  undefined8 uVar4;
  bool bVar5;
  any *paVar6;
  int *piVar7;
  double *pdVar8;
  ulong *puVar9;
  long lVar10;
  pointer *__ptr_1;
  ulong uVar11;
  pointer *__ptr;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined2 local_3c;
  
  anon_unknown_6::create_nucleus((anon_unknown_6 *)this,var_map,0);
  anon_unknown_6::create_nucleus((anon_unknown_6 *)&this->nucleusB_,var_map,1);
  NucleonProfile::NucleonProfile(&this->nucleon_profile_,var_map);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number-events","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar7 = boost::any_cast<int_const&>(paVar6);
  iVar1 = *piVar7;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->nevents_ = iVar1;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"b-min","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar8 = boost::any_cast<double_const&>(paVar6);
  dVar13 = *pdVar8;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->bmin_ = dVar13;
  _Var2._M_head_impl =
       (this->nucleusA_)._M_t.
       super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
       super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
       super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  pNVar3 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
           super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  local_40 = 0x616d2d62;
  local_3c = 0x78;
  local_48 = 5;
  local_50 = &local_40;
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar8 = boost::any_cast<double_const&>(paVar6);
  dVar13 = *pdVar8;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (dVar13 < 0.0) {
    dVar12 = (double)(**(code **)((long)(_Var2._M_head_impl)->_vptr_Nucleus + 0x10))
                               (_Var2._M_head_impl);
    dVar14 = dVar12;
    (*pNVar3->_vptr_Nucleus[2])(pNVar3);
    dVar13 = (this->nucleon_profile_).max_impact_sqr_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar13;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      auVar15 = vsqrtsd_avx(auVar15,auVar15);
      dVar13 = auVar15._0_8_;
    }
    dVar13 = dVar14 + dVar12 + dVar13;
  }
  this->bmax_ = dVar13;
  pNVar3 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
           super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  dVar14 = (double)(**(code **)((long)((this->nucleusA_)._M_t.
                                       super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>
                                       .super__Head_base<0UL,_glauber::Nucleus_*,_false>.
                                      _M_head_impl)->_vptr_Nucleus + 0x10))();
  dVar13 = dVar14;
  (*pNVar3->_vptr_Nucleus[2])(pNVar3);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar14 + dVar13;
  uVar4 = vcmpsd_avx512f(auVar16,ZEXT816(0x3fb999999999999a),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  this->asymmetry_ =
       (double)((ulong)bVar5 * 0x3fe0000000000000 +
               (ulong)!bVar5 * (long)(dVar14 / (dVar14 + dVar13)));
  Event::Event(&this->event_,var_map);
  Output::Output(&this->output_,var_map);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"random-seed","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  puVar9 = (ulong *)boost::any_cast<long_const&>(paVar6);
  uVar11 = *puVar9;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (0 < (long)uVar11) {
    lVar10 = 1;
    random::engine = uVar11;
    do {
      uVar11 = (uVar11 >> 0x3e ^ uVar11) * 0x5851f42d4c957f2d + lVar10;
      (&random::engine)[lVar10] = uVar11;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x138);
    DAT_0013cee8 = 0x138;
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_profile_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_profile_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}